

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O1

HeapType __thiscall wasm::anon_unknown_0::TypeMerging::getMerged(TypeMerging *this,HeapType type)

{
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> _Var1;
  key_type local_20;
  HeapType type_local;
  
  local_20.id = type.id;
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->merges)._M_h,&local_20);
  if (_Var1._M_cur != (__node_type *)0x0) {
    do {
      local_20.id = *(uintptr_t *)
                     ((long)&((_Var1._M_cur)->
                             super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::HeapType>_>
                             ._M_storage._M_storage + 8);
      _Var1._M_cur = (__node_type *)
                     std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(this->merges)._M_h,&local_20);
    } while (_Var1._M_cur != (__node_type *)0x0);
  }
  return (HeapType)local_20.id;
}

Assistant:

HeapType getMerged(HeapType type) {
    for (auto it = merges.find(type); it != merges.end();
         it = merges.find(type)) {
      type = it->second;
    }
    return type;
  }